

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O0

cmSourceGroup * __thiscall cmSourceGroup::operator=(cmSourceGroup *this,cmSourceGroup *r)

{
  type pcVar1;
  type this_00;
  cmSourceGroup *r_local;
  cmSourceGroup *this_local;
  
  std::__cxx11::string::operator=((string *)this,(string *)r);
  cmsys::RegularExpression::operator=(&this->GroupRegex,&r->GroupRegex);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->GroupFiles,&r->GroupFiles);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::operator=
            (&this->SourceFiles,&r->SourceFiles);
  pcVar1 = std::unique_ptr<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_>::
           operator*(&r->Internal);
  this_00 = std::unique_ptr<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_>::
            operator*(&this->Internal);
  cmSourceGroupInternals::operator=(this_00,pcVar1);
  return this;
}

Assistant:

cmSourceGroup& cmSourceGroup::operator=(cmSourceGroup const& r)
{
  this->Name = r.Name;
  this->GroupRegex = r.GroupRegex;
  this->GroupFiles = r.GroupFiles;
  this->SourceFiles = r.SourceFiles;
  *(this->Internal) = *(r.Internal);
  return *this;
}